

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<burst::union_iterator<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>>>,std::less<void>>>,std::__cxx11::string>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<burst::union_iterator<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<void>_>_>
          *lhs,char *op,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  toStream<boost::iterator_range<burst::union_iterator<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>>>,std::less<void>>>>
            (&local_48,this,lhs);
  String::String(&local_60,(char *)lhs);
  doctest::operator+(&local_30,&local_48,&local_60);
  toStream<std::__cxx11::string>(&SStack_78,(detail *)op,in);
  doctest::operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }